

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

void Fra_SmlSimulateOne(Fra_Sml_t *p)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pIn;
  abctime aVar5;
  abctime clk;
  int i;
  int f;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Fra_Sml_t *p_local;
  
  aVar3 = Abc_Clock();
  for (clk._4_4_ = 0; clk._4_4_ < p->nFrames; clk._4_4_ = clk._4_4_ + 1) {
    for (clk._0_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), (int)clk < iVar1;
        clk._0_4_ = (int)clk + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,(int)clk);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        Fra_SmlNodeSimulate(p,pAVar4,clk._4_4_);
      }
    }
    clk._0_4_ = 0;
    while( true ) {
      iVar1 = Aig_ManCoNum(p->pAig);
      iVar2 = Aig_ManRegNum(p->pAig);
      if (iVar1 - iVar2 <= (int)clk) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,(int)clk);
      Fra_SmlNodeCopyFanin(p,pAVar4,clk._4_4_);
      clk._0_4_ = (int)clk + 1;
    }
    if (clk._4_4_ == p->nFrames + -1) break;
    iVar1 = Aig_ManCoNum(p->pAig);
    iVar2 = Aig_ManRegNum(p->pAig);
    for (clk._0_4_ = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->pAig->vCos), (int)clk < iVar1;
        clk._0_4_ = (int)clk + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,(int)clk);
      Fra_SmlNodeCopyFanin(p,pAVar4,clk._4_4_);
    }
    for (clk._0_4_ = 0; iVar1 = Aig_ManRegNum(p->pAig), (int)clk < iVar1; clk._0_4_ = (int)clk + 1)
    {
      pAVar4 = Aig_ManLi(p->pAig,(int)clk);
      pIn = Aig_ManLo(p->pAig,(int)clk);
      Fra_SmlNodeTransferNext(p,pAVar4,pIn,clk._4_4_);
    }
  }
  aVar5 = Abc_Clock();
  p->timeSim = p->timeSim + ((int)aVar5 - (int)aVar3);
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Fra_SmlSimulateOne( Fra_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int f, i;
    abctime clk;
clk = Abc_Clock();
    for ( f = 0; f < p->nFrames; f++ )
    {
        // simulate the nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            Fra_SmlNodeSimulate( p, pObj, f );
        // copy simulation info into outputs
        Aig_ManForEachPoSeq( p->pAig, pObj, i )
            Fra_SmlNodeCopyFanin( p, pObj, f );
        // quit if this is the last timeframe
        if ( f == p->nFrames - 1 )
            break;
        // copy simulation info into outputs
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            Fra_SmlNodeCopyFanin( p, pObj, f );
        // copy simulation info into the inputs
        Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObjLo, i )
            Fra_SmlNodeTransferNext( p, pObjLi, pObjLo, f );
    }
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}